

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeLoad(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  Expression *pEVar2;
  
  if ((this->allowMemory == true) && ((type.id & 1) != 0 || type.id < 7)) {
    pEVar2 = makeNonAtomicLoad(this,type);
    if (((type.id & 0xfffffffffffffffe) == 2) && (((byte)this->wasm[0x178] & 1) != 0)) {
      uVar1 = Random::upTo(&this->random,2);
      if (uVar1 != 0) {
        if (pEVar2->_id != LoadId) {
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                        ,0x31b,"T *wasm::Expression::cast() [T = wasm::Load]");
        }
        *(undefined1 *)(**(long **)(this->wasm + 0x78) + 0x48) = 1;
        *(undefined1 *)&pEVar2[2].type.id = 1;
        pEVar2[1].field_0x1 = 0;
        *(ulong *)(pEVar2 + 2) = (ulong)pEVar2[1]._id;
      }
    }
    return pEVar2;
  }
  pEVar2 = makeTrivial(this,type);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeLoad(Type type) {
  // reference types cannot be stored in memory
  if (!allowMemory || type.isRef()) {
    return makeTrivial(type);
  }
  auto* ret = makeNonAtomicLoad(type);
  if (type != Type::i32 && type != Type::i64) {
    return ret;
  }
  if (!wasm.features.hasAtomics() || oneIn(2)) {
    return ret;
  }
  // make it atomic
  auto* load = ret->cast<Load>();
  wasm.memories[0]->shared = true;
  load->isAtomic = true;
  load->signed_ = false;
  load->align = load->bytes;
  return load;
}